

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

void timerepr_to_string(TimeRepr *repr,char *string,size_t n)

{
  int iVar1;
  int amt_5;
  int amt_4;
  int amt_3;
  int amt_2;
  int amt_1;
  int amt;
  size_t rem;
  char *s;
  size_t n_local;
  char *string_local;
  TimeRepr *repr_local;
  
  _amt_1 = n;
  rem = (size_t)string;
  if (0 < repr->days) {
    iVar1 = snprintf(string,n,"%d day(s), ",(ulong)(uint)repr->days);
    rem = (size_t)(string + iVar1);
    _amt_1 = n - (long)iVar1;
  }
  if (0 < repr->hours) {
    iVar1 = snprintf((char *)rem,_amt_1,"%d hours(s), ",(ulong)(uint)repr->hours);
    rem = rem + (long)iVar1;
    _amt_1 = _amt_1 - (long)iVar1;
  }
  if (0 < repr->minutes) {
    iVar1 = snprintf((char *)rem,_amt_1,"%d minutes(s), ",(ulong)(uint)repr->minutes);
    rem = rem + (long)iVar1;
    _amt_1 = _amt_1 - (long)iVar1;
  }
  if (0 < repr->seconds) {
    iVar1 = snprintf((char *)rem,_amt_1,"%d seconds(s), ",(ulong)(uint)repr->seconds);
    rem = rem + (long)iVar1;
    _amt_1 = _amt_1 - (long)iVar1;
  }
  if (0 < repr->milliseconds) {
    iVar1 = snprintf((char *)rem,_amt_1,"%d msec(s), ",(ulong)(uint)repr->milliseconds);
    rem = rem + (long)iVar1;
    _amt_1 = _amt_1 - (long)iVar1;
  }
  if (0 < repr->microseconds) {
    snprintf((char *)rem,_amt_1,"%d usec(s)",(ulong)(uint)repr->microseconds);
  }
  string[n - 1] = '\0';
  return;
}

Assistant:

void timerepr_to_string(const TimeRepr *repr, char *string, size_t n) {
    char *s = string;
    size_t rem = n;
    if (repr->days > 0) {
        int amt = snprintf(s, rem, "%d day(s), ", repr->days);
        s += amt;
        rem -= amt;
    }

    if (repr->hours > 0) {
        int amt = snprintf(s, rem, "%d hours(s), ", repr->hours);
        s += amt;
        rem -= amt;
    }

    if (repr->minutes > 0) {
        int amt = snprintf(s, rem, "%d minutes(s), ", repr->minutes);
        s += amt;
        rem -= amt;
    }

    if (repr->seconds > 0) {
        int amt = snprintf(s, rem, "%d seconds(s), ", repr->seconds);
        s += amt;
        rem -= amt;
    }

    if (repr->milliseconds > 0) {
        int amt = snprintf(s, rem, "%d msec(s), ", repr->milliseconds);
        s += amt;
        rem -= amt;
    }

    if (repr->microseconds > 0) {
        int amt = snprintf(s, rem, "%d usec(s)", repr->microseconds);
        s += amt;
        rem -= amt;
    }
    string[n - 1] = 0;
}